

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_chrm_int(spng_ctx *ctx,spng_chrm_int *chrm_int)

{
  uint32_t uVar1;
  int iVar2;
  int ret;
  spng_chrm_int *chrm_int_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (chrm_int == (spng_chrm_int *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      iVar2 = check_chrm_int(chrm_int);
      if (iVar2 == 0) {
        uVar1 = chrm_int->white_point_y;
        (ctx->chrm_int).white_point_x = chrm_int->white_point_x;
        (ctx->chrm_int).white_point_y = uVar1;
        uVar1 = chrm_int->red_y;
        (ctx->chrm_int).red_x = chrm_int->red_x;
        (ctx->chrm_int).red_y = uVar1;
        uVar1 = chrm_int->green_y;
        (ctx->chrm_int).green_x = chrm_int->green_x;
        (ctx->chrm_int).green_y = uVar1;
        uVar1 = chrm_int->blue_y;
        (ctx->chrm_int).blue_x = chrm_int->blue_x;
        (ctx->chrm_int).blue_y = uVar1;
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xfffffffb | 4);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xfffffffb | 4);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 0x22;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_chrm_int(spng_ctx *ctx, struct spng_chrm_int *chrm_int)
{
    SPNG_SET_CHUNK_BOILERPLATE(chrm_int);

    if(check_chrm_int(chrm_int)) return SPNG_ECHRM;

    ctx->chrm_int = *chrm_int;

    ctx->stored.chrm = 1;
    ctx->user.chrm = 1;

    return 0;
}